

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int compareFileMem(char *filename,char *mem,int size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  int local_10d4;
  undefined1 local_10d0 [4];
  int ix;
  stat info;
  char local_1038 [4];
  int idx;
  char bytes [4096];
  int fd;
  int res;
  int size_local;
  char *mem_local;
  char *filename_local;
  
  info.__glibc_reserved[2]._4_4_ = 0;
  if (update_results == 0) {
    iVar1 = stat64(filename,(stat64 *)local_10d0);
    if (iVar1 < 0) {
      fprintf(_stderr,"failed to stat %s\n",filename);
      filename_local._4_4_ = 0xffffffff;
    }
    else if (info.st_rdev == (long)size) {
      iVar1 = open64(filename,0);
      if (iVar1 < 0) {
        fprintf(_stderr,"failed to open %s for reading",filename);
        filename_local._4_4_ = 0xffffffff;
      }
      else {
        for (; (int)info.__glibc_reserved[2]._4_4_ < size;
            info.__glibc_reserved[2]._4_4_ = iVar2 + info.__glibc_reserved[2]._4_4_) {
          sVar4 = read(iVar1,local_1038,0x1000);
          iVar2 = (int)sVar4;
          if ((iVar2 < 1) || (size < (int)(iVar2 + info.__glibc_reserved[2]._4_4_))) break;
          iVar3 = memcmp(local_1038,mem + (int)info.__glibc_reserved[2]._4_4_,(long)iVar2);
          if (iVar3 != 0) {
            for (local_10d4 = 0;
                (local_10d4 < iVar2 &&
                (local_1038[local_10d4] == mem[(int)(info.__glibc_reserved[2]._4_4_ + local_10d4)]))
                ; local_10d4 = local_10d4 + 1) {
            }
            fprintf(_stderr,"Compare error at position %d\n",
                    (ulong)(info.__glibc_reserved[2]._4_4_ + local_10d4));
            close(iVar1);
            return 1;
          }
        }
        close(iVar1);
        if (info.__glibc_reserved[2]._4_4_ != size) {
          fprintf(_stderr,"Compare error index %d, size %d\n",(ulong)info.__glibc_reserved[2]._4_4_,
                  (ulong)(uint)size);
        }
        filename_local._4_4_ = (uint)(info.__glibc_reserved[2]._4_4_ != size);
      }
    }
    else {
      fprintf(_stderr,"file %s is %ld bytes, result is %d bytes\n",filename,info.st_rdev,
              (ulong)(uint)size);
      filename_local._4_4_ = 0xffffffff;
    }
  }
  else {
    iVar1 = open64(filename,0x241,0x1a4);
    if (iVar1 < 0) {
      fprintf(_stderr,"failed to open %s for writing",filename);
      filename_local._4_4_ = 0xffffffff;
    }
    else {
      sVar4 = write(iVar1,mem,(long)size);
      close(iVar1);
      filename_local._4_4_ = (uint)((int)sVar4 != size);
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int compareFileMem(const char *filename, const char *mem, int size) {
    int res;
    int fd;
    char bytes[4096];
    int idx = 0;
    struct stat info;

    if (update_results) {
        fd = open(filename, WR_FLAGS, 0644);
        if (fd < 0) {
	    fprintf(stderr, "failed to open %s for writing", filename);
            return(-1);
	}
        res = write(fd, mem, size);
        close(fd);
        return(res != size);
    }

    if (stat(filename, &info) < 0) {
        fprintf(stderr, "failed to stat %s\n", filename);
	return(-1);
    }
    if (info.st_size != size) {
        fprintf(stderr, "file %s is %ld bytes, result is %d bytes\n",
	        filename, (long) info.st_size, size);
        return(-1);
    }
    fd = open(filename, RD_FLAGS);
    if (fd < 0) {
	fprintf(stderr, "failed to open %s for reading", filename);
        return(-1);
    }
    while (idx < size) {
        res = read(fd, bytes, 4096);
	if (res <= 0)
	    break;
	if (res + idx > size)
	    break;
	if (memcmp(bytes, &mem[idx], res) != 0) {
	    int ix;
	    for (ix=0; ix<res; ix++)
		if (bytes[ix] != mem[idx+ix])
			break;
	    fprintf(stderr,"Compare error at position %d\n", idx+ix);
	    close(fd);
	    return(1);
	}
	idx += res;
    }
    close(fd);
    if (idx != size) {
	fprintf(stderr,"Compare error index %d, size %d\n", idx, size);
    }
    return(idx != size);
}